

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O0

REF_STATUS
ref_inflate_rail_node
          (REF_GRID ref_grid,REF_DICT faceids,REF_INT node,REF_BOOL *in_rail,REF_INT *ind)

{
  REF_CELL ref_cell;
  REF_BOOL RVar1;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nactive;
  REF_INT i;
  REF_INT ids [4];
  REF_INT n_id;
  REF_INT max_id;
  REF_CELL tri;
  REF_INT *ind_local;
  REF_BOOL *in_rail_local;
  REF_INT node_local;
  REF_DICT faceids_local;
  REF_GRID ref_grid_local;
  
  ref_cell = ref_grid->cell[3];
  ids[3] = 4;
  ids[2] = 0;
  *in_rail = 0;
  *ind = -1;
  ref_grid_local._4_4_ = ref_cell_id_list_around(ref_cell,node,4,ids + 2,&nactive);
  if (ref_grid_local._4_4_ == 0) {
    ref_private_macro_code_rss_1 = 0;
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ids[2];
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      RVar1 = ref_dict_has_key(faceids,(&nactive)[ref_private_macro_code_rss]);
      if (RVar1 != 0) {
        uVar2 = ref_dict_location(faceids,(&nactive)[ref_private_macro_code_rss],ind);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                 ,0x240,"ref_inflate_rail_node",(ulong)uVar2,"faceid loc");
          return uVar2;
        }
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
      }
    }
    if (ref_private_macro_code_rss_1 < 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
             0x244,"ref_inflate_rail_node","no tris active");
      ref_grid_local._4_4_ = 1;
    }
    else if (ref_private_macro_code_rss_1 < 3) {
      *in_rail = (uint)(1 < ref_private_macro_code_rss_1);
      if (*in_rail != 0) {
        *ind = -1;
      }
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
             0x245,"ref_inflate_rail_node","three or more tri actve");
      ref_grid_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x23c
           ,"ref_inflate_rail_node",(ulong)ref_grid_local._4_4_,"ids");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_inflate_rail_node(REF_GRID ref_grid,
                                                REF_DICT faceids, REF_INT node,
                                                REF_BOOL *in_rail,
                                                REF_INT *ind) {
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_INT max_id = 4, n_id = 0, ids[4], i, nactive;
  *in_rail = REF_FALSE;
  *ind = REF_EMPTY;
  RSS(ref_cell_id_list_around(tri, node, max_id, &n_id, ids), "ids");
  nactive = 0;
  for (i = 0; i < n_id; i++) {
    if (ref_dict_has_key(faceids, ids[i])) {
      RSS(ref_dict_location(faceids, ids[i], ind), "faceid loc");
      nactive++;
    }
  }
  RAS(nactive > 0, "no tris active");
  RAS(nactive < 3, "three or more tri actve");
  *in_rail = (nactive > 1);
  if (*in_rail) *ind = REF_EMPTY;
  return REF_SUCCESS;
}